

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  string *psVar1;
  uint uVar2;
  cmCTest *pcVar3;
  cmCTestTestProperties *pcVar4;
  bool bVar5;
  ostream *poVar6;
  cmProcess *pcVar7;
  _Base_ptr p_Var8;
  string *psVar9;
  cmCTestTestProperties *pcVar10;
  long lVar11;
  pointer pbVar12;
  double testTimeOut;
  string msg;
  char *local_1d0 [4];
  string *local_1b0;
  ostringstream cmCTestLog_msg;
  long alStack_198 [45];
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  lVar11 = 0xe;
  if (total < 100) {
    lVar11 = (ulong)(9 < total) * 2 + 10;
  }
  *(long *)((long)alStack_198 + *(long *)(_cmCTestLog_msg + -0x18)) = lVar11;
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Start ");
  uVar2 = this->TestHandler->MaxIndex;
  lVar11 = 3;
  if (uVar2 < 100) {
    lVar11 = 2 - (ulong)(uVar2 < 10);
  }
  *(long *)(&poVar6->field_0x10 + (long)poVar6->_vptr_basic_ostream[-3]) = lVar11;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->TestProperties->Index);
  poVar6 = std::operator<<(poVar6,": ");
  poVar6 = std::operator<<(poVar6,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1aa,msg._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  if (this->TestProperties->Disabled == true) {
    (this->TestResult).Properties = this->TestProperties;
    (this->TestResult).ExecutionTime = 0.0;
    (this->TestResult).CompressOutput = false;
    (this->TestResult).ReturnValue = -1;
    std::__cxx11::string::assign((char *)&(this->TestResult).CompletionStatus);
    (this->TestResult).Status = 0;
    (this->TestResult).TestCount = this->TestProperties->Index;
    std::__cxx11::string::_M_assign((string *)&this->TestResult);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
    pcVar7 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar7);
    this->TestProcess = pcVar7;
    std::__cxx11::string::assign((char *)&(this->TestResult).Output);
    std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
  }
  else {
    ComputeArguments(this);
    pcVar4 = this->TestProperties;
    (this->TestResult).Properties = pcVar4;
    (this->TestResult).ExecutionTime = 0.0;
    (this->TestResult).CompressOutput = false;
    (this->TestResult).ReturnValue = -1;
    psVar1 = &(this->TestResult).CompletionStatus;
    std::__cxx11::string::assign((char *)psVar1);
    (this->TestResult).Status = 8;
    (this->TestResult).TestCount = this->TestProperties->Index;
    std::__cxx11::string::_M_assign((string *)&this->TestResult);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
    if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pbVar12 = (pcVar4->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(pcVar4->Args).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) ||
         (bVar5 = std::operator==(pbVar12 + 1,"NOT_AVAILABLE"), !bVar5)) {
        pcVar10 = this->TestProperties;
        pbVar12 = (pcVar10->RequiredFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          if (pbVar12 ==
              (pcVar10->RequiredFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            bVar5 = std::operator==(&this->ActualCommand,"");
            if (bVar5) {
              pcVar7 = (cmProcess *)operator_new(0xc0);
              cmProcess::cmProcess(pcVar7);
              this->TestProcess = pcVar7;
              poVar6 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
              poVar6 = std::operator<<(poVar6,(string *)
                                              ((pcVar4->Args).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 1));
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find executable: ");
              poVar6 = std::operator<<(poVar6,(string *)
                                              ((pcVar4->Args).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 1));
              std::endl<char,std::char_traits<char>>(poVar6);
              pcVar3 = this->CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar3,6,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                           ,0x20b,msg._M_dataplus._M_p,false);
              std::__cxx11::string::~string((string *)&msg);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &cmCTestLog_msg,"Unable to find executable: ",
                             (pcVar4->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
              std::__cxx11::string::operator=
                        ((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg);
              std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
              std::__cxx11::string::assign((char *)psVar1);
              (this->TestResult).Status = 0;
              return false;
            }
            cmCTest::CurrentTime_abi_cxx11_((string *)&cmCTestLog_msg,this->CTest);
            std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg);
            testTimeOut = ResolveTimeout(this);
            if (this->StopTimePassed != false) {
              return false;
            }
            bVar5 = ForkProcess(this,testTimeOut,this->TestProperties->ExplicitTimeout,
                                &this->TestProperties->Environment);
            return bVar5;
          }
          std::__cxx11::string::string((string *)&msg,(string *)pbVar12);
          bVar5 = cmsys::SystemTools::FileExists(msg._M_dataplus._M_p);
          if (!bVar5) break;
          std::__cxx11::string::~string((string *)&msg);
          pbVar12 = pbVar12 + 1;
          pcVar10 = this->TestProperties;
        }
        pcVar7 = (cmProcess *)operator_new(0xc0);
        cmProcess::cmProcess(pcVar7);
        this->TestProcess = pcVar7;
        poVar6 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
        poVar6 = std::operator<<(poVar6,(string *)&msg);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find required file: ");
        poVar6 = std::operator<<(poVar6,(string *)&msg);
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x1fb,local_1d0[0],false);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg,"Unable to find required file: ",&msg);
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
        std::__cxx11::string::assign((char *)psVar1);
      }
      else {
        pcVar7 = (cmProcess *)operator_new(0xc0);
        cmProcess::cmProcess(pcVar7);
        this->TestProcess = pcVar7;
        msg._M_dataplus._M_p = (pointer)&msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        psVar9 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
        if (psVar9->_M_string_length == 0) {
          std::__cxx11::string::assign((char *)&msg);
        }
        else {
          std::__cxx11::string::assign((char *)&msg);
          cmCTest::GetConfigType_abi_cxx11_(this->CTest);
          std::__cxx11::string::append((string *)&msg);
        }
        std::__cxx11::string::append((char *)&msg);
        poVar6 = std::operator<<(this->TestHandler->LogFile,(string *)&msg);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x1e7,local_1d0[0],false);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
        std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
        std::__cxx11::string::assign((char *)psVar1);
      }
    }
    else {
      pcVar7 = (cmProcess *)operator_new(0xc0);
      cmProcess::cmProcess(pcVar7);
      this->TestProcess = pcVar7;
      local_1b0 = psVar1;
      std::__cxx11::string::string
                ((string *)&msg,"Failed test dependencies:",(allocator *)&cmCTestLog_msg);
      for (p_Var8 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 !=
          &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
        std::__cxx11::string::append((string *)&msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      }
      poVar6 = std::operator<<(this->TestHandler->LogFile,(string *)&msg);
      psVar1 = local_1b0;
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x1d3,local_1d0[0],false);
      std::__cxx11::string::~string((string *)local_1d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
      std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
      std::__cxx11::string::assign((char *)psVar1);
    }
    (this->TestResult).Status = 0;
    std::__cxx11::string::~string((string *)&msg);
  }
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2 * getNumWidth(total) + 8)
               << "Start "
               << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
               << this->TestProperties->Index << ": "
               << this->TestProperties->Name << std::endl);
  this->ProcessOutput.clear();

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.Properties = this->TestProperties;
    this->TestResult.ExecutionTime = 0;
    this->TestResult.CompressOutput = false;
    this->TestResult.ReturnValue = -1;
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.TestCount = this->TestProperties->Index;
    this->TestResult.Name = this->TestProperties->Name;
    this->TestResult.Path = this->TestProperties->Directory;
    this->TestProcess = new cmProcess;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine = "";
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  if (!this->FailedDependencies.empty()) {
    this->TestProcess = new cmProcess;
    std::string msg = "Failed test dependencies:";
    for (std::set<std::string>::const_iterator it =
           this->FailedDependencies.begin();
         it != this->FailedDependencies.end(); ++it) {
      msg += " " + *it;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    this->TestProcess = new cmProcess;
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
    } else {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::vector<std::string>::iterator i =
         this->TestProperties->RequiredFiles.begin();
       i != this->TestProperties->RequiredFiles.end(); ++i) {
    std::string file = *i;

    if (!cmSystemTools::FileExists(file.c_str())) {
      // Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand == "") {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if (this->StopTimePassed) {
    return false;
  }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}